

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialTexture
                   (aiMaterial *mat,aiTextureType type,uint index,aiString *path,
                   aiTextureMapping *_mapping,uint *uvindex,ai_real *blend,aiTextureOp *op,
                   aiTextureMapMode *mapmode,uint *flags)

{
  aiReturn aVar1;
  uint local_3c;
  aiTextureMapping mapping;
  int mapping_;
  uint *uvindex_local;
  aiTextureMapping *_mapping_local;
  aiString *path_local;
  uint index_local;
  aiTextureType type_local;
  aiMaterial *mat_local;
  
  _mapping = uvindex;
  uvindex_local = _mapping;
  _mapping_local = &path->length;
  path_local._0_4_ = index;
  path_local._4_4_ = type;
  _index_local = mat;
  if (mat == (aiMaterial *)0x0) {
    __assert_fail("__null != mat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x166,
                  "aiReturn aiGetMaterialTexture(const aiMaterial *, aiTextureType, unsigned int, aiString *, aiTextureMapping *, unsigned int *, ai_real *, aiTextureOp *, aiTextureMapMode *, unsigned int *)"
                 );
  }
  if (path != (aiString *)0x0) {
    aVar1 = aiGetMaterialString(mat,"$tex.file",type,index,path);
    if (aVar1 == aiReturn_SUCCESS) {
      local_3c = 0;
      aiGetMaterialInteger
                (_index_local,"$tex.mapping",path_local._4_4_,(uint)path_local,(int *)&local_3c);
      if (uvindex_local != (uint *)0x0) {
        *uvindex_local = local_3c;
      }
      if ((local_3c == 0) && (_mapping != (uint *)0x0)) {
        aiGetMaterialInteger
                  (_index_local,"$tex.uvwsrc",path_local._4_4_,(uint)path_local,(int *)_mapping);
      }
      if (blend != (ai_real *)0x0) {
        aiGetMaterialFloat(_index_local,"$tex.blend",path_local._4_4_,(uint)path_local,blend);
      }
      if (op != (aiTextureOp *)0x0) {
        aiGetMaterialInteger(_index_local,"$tex.op",path_local._4_4_,(uint)path_local,(int *)op);
      }
      if (mapmode != (aiTextureMapMode *)0x0) {
        aiGetMaterialInteger
                  (_index_local,"$tex.mapmodeu",path_local._4_4_,(uint)path_local,(int *)mapmode);
        aiGetMaterialInteger
                  (_index_local,"$tex.mapmodev",path_local._4_4_,(uint)path_local,
                   (int *)(mapmode + 1));
      }
      if (flags != (uint *)0x0) {
        aiGetMaterialInteger
                  (_index_local,"$tex.flags",path_local._4_4_,(uint)path_local,(int *)flags);
      }
      mat_local._4_4_ = aiReturn_SUCCESS;
    }
    else {
      mat_local._4_4_ = aiReturn_FAILURE;
    }
    return mat_local._4_4_;
  }
  __assert_fail("__null != path",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                ,0x167,
                "aiReturn aiGetMaterialTexture(const aiMaterial *, aiTextureType, unsigned int, aiString *, aiTextureMapping *, unsigned int *, ai_real *, aiTextureOp *, aiTextureMapMode *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialTexture(const C_STRUCT aiMaterial* mat,
    aiTextureType type,
    unsigned int  index,
    C_STRUCT aiString* path,
    aiTextureMapping* _mapping  /*= NULL*/,
    unsigned int* uvindex       /*= NULL*/,
    ai_real* blend              /*= NULL*/,
    aiTextureOp* op             /*= NULL*/,
    aiTextureMapMode* mapmode   /*= NULL*/,
    unsigned int* flags         /*= NULL*/
    )
{
    ai_assert( NULL != mat );
    ai_assert( NULL != path );

    // Get the path to the texture
    if (AI_SUCCESS != aiGetMaterialString(mat,AI_MATKEY_TEXTURE(type,index),path))  {
        return AI_FAILURE;
    }

    // Determine mapping type
    int mapping_ = static_cast<int>(aiTextureMapping_UV);
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPING(type,index), &mapping_);
    aiTextureMapping mapping = static_cast<aiTextureMapping>(mapping_);
    if (_mapping)
        *_mapping = mapping;

    // Get UV index
    if (aiTextureMapping_UV == mapping && uvindex)  {
        aiGetMaterialInteger(mat,AI_MATKEY_UVWSRC(type,index),(int*)uvindex);
    }
    // Get blend factor
    if (blend)  {
        aiGetMaterialFloat(mat,AI_MATKEY_TEXBLEND(type,index),blend);
    }
    // Get texture operation
    if (op){
        aiGetMaterialInteger(mat,AI_MATKEY_TEXOP(type,index),(int*)op);
    }
    // Get texture mapping modes
    if (mapmode)    {
        aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_U(type,index),(int*)&mapmode[0]);
        aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_V(type,index),(int*)&mapmode[1]);
    }
    // Get texture flags
    if (flags){
        aiGetMaterialInteger(mat,AI_MATKEY_TEXFLAGS(type,index),(int*)flags);
    }

    return AI_SUCCESS;
}